

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::GetTapBranchInfoRequest::ConvertFromStruct
          (GetTapBranchInfoRequest *this,GetTapBranchInfoRequestStruct *data)

{
  GetTapBranchInfoRequestStruct *data_local;
  GetTapBranchInfoRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->tree_string_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->tapscript_,(string *)&data->tapscript);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->nodes_,&data->nodes);
  this->index_ = data->index;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void GetTapBranchInfoRequest::ConvertFromStruct(
    const GetTapBranchInfoRequestStruct& data) {
  tree_string_ = data.tree_string;
  tapscript_ = data.tapscript;
  nodes_.ConvertFromStruct(data.nodes);
  index_ = data.index;
  ignore_items = data.ignore_items;
}